

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::getOffsetRange(TextureGatherCase *this)

{
  int iVar1;
  long *plVar2;
  undefined4 uVar3;
  IVec2 IVar4;
  long in_RSI;
  
  iVar1 = *(int *)(in_RSI + 0x7c);
  if (iVar1 == 0) {
    IVar4.m_data[0] = 0;
    IVar4.m_data[1] = 0;
    uVar3 = 0;
  }
  else if (iVar1 == 2) {
    plVar2 = *(long **)(*(long *)(in_RSI + 0x70) + 0x10);
    uVar3 = (**(code **)(*plVar2 + 0x10))(plVar2,0x8e5e);
    plVar2 = *(long **)(*(long *)(in_RSI + 0x70) + 0x10);
    IVar4.m_data = (int  [2])(**(code **)(*plVar2 + 0x10))(plVar2,0x8e5f);
  }
  else if (iVar1 == 1) {
    IVar4.m_data[0] = 7;
    IVar4.m_data[1] = 0;
    uVar3 = 0xfffffff8;
  }
  else {
    uVar3 = 0xffffffff;
    IVar4.m_data[0] = -1;
    IVar4.m_data[1] = 0;
  }
  *(undefined4 *)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = uVar3;
  *(int *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4) =
       IVar4.m_data[0];
  return (IVec2)IVar4.m_data;
}

Assistant:

IVec2 TextureGatherCase::getOffsetRange (void) const
{
	switch (m_offsetSize)
	{
		case OFFSETSIZE_NONE:
			return IVec2(0);
			break;

		case OFFSETSIZE_MINIMUM_REQUIRED:
			// \note Defined by spec.
			return IVec2(SPEC_MAX_MIN_OFFSET,
						 SPEC_MIN_MAX_OFFSET);
			break;

		case OFFSETSIZE_IMPLEMENTATION_MAXIMUM:
			return IVec2(m_context.getContextInfo().getInt(GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET),
						 m_context.getContextInfo().getInt(GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET));
			break;

		default:
			DE_ASSERT(false);
			return IVec2(-1);
	}
}